

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestServer.cpp
# Opt level: O2

void __thiscall testListenConnectConnect()::Handler::onConnected(Handler *this)

{
  Client *in_RSI;
  
  onConnected(Server::Client__(this + -8,in_RSI);
  return;
}

Assistant:

Server::Client::ICallback *onConnected(Server::Client &client) override
    {
      if (!_client1)
        _client1 = &client;
      else
      {
        ASSERT(!_client3);
        _client3 = &client;
      }
      checkShutdown();
      return this;
    }